

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

Var Js::JavascriptObject::GetToStringTagValue
              (RecyclableObject *thisArg,ScriptContext *scriptContext)

{
  bool bVar1;
  JavascriptLibrary *this;
  RecyclableObject *local_78;
  Var value;
  PropertyValueInfo info;
  PolymorphicInlineCache *cache;
  PropertyId toStringTagId;
  ScriptContext *scriptContext_local;
  RecyclableObject *thisArg_local;
  
  bVar1 = Js::JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(thisArg);
  if (bVar1) {
    thisArg_local = (RecyclableObject *)0x0;
  }
  else {
    this = ScriptContext::GetLibrary(scriptContext);
    info._56_8_ = JavascriptLibrary::GetToStringTagCache(this);
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)&value);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)&value,(PolymorphicInlineCache *)info._56_8_,false);
    bVar1 = CacheOperators::TryGetProperty<true,true,true,true,true,true,false,true,false,false>
                      (thisArg,false,thisArg,0x1b,&local_78,scriptContext,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)&value);
    if (bVar1) {
      thisArg_local = local_78;
    }
    else {
      bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
      if ((bVar1) && ((DAT_01ec73ca & 1) != 0)) {
        CacheOperators::TraceCache
                  ((PolymorphicInlineCache *)info._56_8_,L"PatchGetValue",0x1b,scriptContext,thisArg
                  );
      }
      thisArg_local =
           (RecyclableObject *)
           Js::JavascriptOperators::GetProperty
                     (thisArg,thisArg,0x1b,scriptContext,(PropertyValueInfo *)&value);
    }
  }
  return thisArg_local;
}

Assistant:

Var JavascriptObject::GetToStringTagValue(RecyclableObject *thisArg, ScriptContext *scriptContext)
{
    if (JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(thisArg))
    {
        return nullptr;
    }

    const PropertyId toStringTagId(PropertyIds::_symbolToStringTag);
    PolymorphicInlineCache *cache = scriptContext->GetLibrary()->GetToStringTagCache();
    PropertyValueInfo info;
    // We don't allow cache resizing, at least for the moment: it's more work, and since there's only one
    // cache per script context, we can afford to create each cache with the maximum size.
    PropertyValueInfo::SetCacheInfo(&info, cache, false);
    Var value;
    if (CacheOperators::TryGetProperty<
        true,                                       // CheckLocal
        true,                                       // CheckProto
        true,                                       // CheckAccessor
        true,                                       // CheckMissing
        true,                                       // CheckPolymorphicInlineCache
        true,                                       // CheckTypePropertyCache
        !PolymorphicInlineCache::IsPolymorphic,     // IsInlineCacheAvailable
        PolymorphicInlineCache::IsPolymorphic,      // IsPolymorphicInlineCacheAvailable
        false,                                      // ReturnOperationInfo
        false>                                      // OutputExistence
        (thisArg, false, thisArg, toStringTagId, &value, scriptContext, nullptr, &info))
    {
        return value;
    }
    else
    {
#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(cache, _u("PatchGetValue"), toStringTagId, scriptContext, thisArg);
        }
#endif
        return JavascriptOperators::GetProperty(thisArg, thisArg, toStringTagId, scriptContext, &info);
    }
}